

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ActionMessage.cpp
# Opt level: O0

void __thiscall
helics::ActionMessage::ActionMessage
          (ActionMessage *this,
          unique_ptr<helics::Message,_std::default_delete<helics::Message>_> *message)

{
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  pointer pMVar1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_RSI;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDI;
  SmallBuffer *in_stack_fffffffffffffeb8;
  SmallBuffer *in_stack_fffffffffffffec0;
  allocator_type *in_stack_fffffffffffffee8;
  undefined1 ***pppuVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__str;
  allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_a9;
  undefined8 *local_a8 [16];
  undefined1 **local_28;
  undefined8 local_20;
  undefined4 local_18;
  undefined4 local_14;
  
  *(undefined4 *)&(in_RDI->_M_dataplus)._M_p = 0x10000014;
  pMVar1 = CLI::std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>::operator->
                     ((unique_ptr<helics::Message,_std::default_delete<helics::Message>_> *)0x5d0c51
                     );
  *(int32_t *)((long)&(in_RDI->_M_dataplus)._M_p + 4) = pMVar1->messageID;
  local_14 = 0;
  GlobalFederateId::GlobalFederateId
            ((GlobalFederateId *)&in_RDI->_M_string_length,(GlobalBrokerId)0x0);
  *(undefined4 *)((long)&in_RDI->_M_string_length + 4) = 0;
  InterfaceHandle::InterfaceHandle((InterfaceHandle *)((long)&in_RDI->_M_string_length + 4));
  local_18 = 0;
  GlobalFederateId::GlobalFederateId((GlobalFederateId *)&in_RDI->field_2,(GlobalBrokerId)0x0);
  *(undefined4 *)((long)&in_RDI->field_2 + 4) = 0;
  InterfaceHandle::InterfaceHandle((InterfaceHandle *)((long)&in_RDI->field_2 + 4));
  *(undefined2 *)((long)&in_RDI->field_2 + 8) = 0;
  pMVar1 = CLI::std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>::operator->
                     ((unique_ptr<helics::Message,_std::default_delete<helics::Message>_> *)0x5d0cdc
                     );
  *(uint16_t *)((long)&in_RDI->field_2 + 10) = pMVar1->flags;
  *(undefined4 *)((long)&in_RDI->field_2 + 0xc) = 0;
  pMVar1 = CLI::std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>::operator->
                     ((unique_ptr<helics::Message,_std::default_delete<helics::Message>_> *)0x5d0cfd
                     );
  in_RDI[1]._M_dataplus._M_p = (pointer)(pMVar1->time).internalTimeCode;
  in_RDI[1]._M_string_length = 0;
  in_RDI[1].field_2._M_allocated_capacity = 0;
  *(undefined8 *)((long)&in_RDI[1].field_2 + 8) = 0;
  __str = in_RDI + 2;
  CLI::std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>::operator->
            ((unique_ptr<helics::Message,_std::default_delete<helics::Message>_> *)0x5d0d37);
  SmallBuffer::SmallBuffer(in_stack_fffffffffffffec0,in_stack_fffffffffffffeb8);
  CLI::std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>::operator->
            ((unique_ptr<helics::Message,_std::default_delete<helics::Message>_> *)0x5d0d62);
  std::__cxx11::string::string(in_RDI,__str);
  CLI::std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>::operator->
            ((unique_ptr<helics::Message,_std::default_delete<helics::Message>_> *)0x5d0d92);
  std::__cxx11::string::string(in_RDI,__str);
  CLI::std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>::operator->
            ((unique_ptr<helics::Message,_std::default_delete<helics::Message>_> *)0x5d0dbd);
  std::__cxx11::string::string(in_RDI,__str);
  CLI::std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>::operator->
            ((unique_ptr<helics::Message,_std::default_delete<helics::Message>_> *)0x5d0de8);
  std::__cxx11::string::string(in_RDI,__str);
  local_20 = 4;
  local_28 = (undefined1 **)local_a8;
  CLI::std::
  allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  allocator((allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)0x5d0e2a);
  __l._M_len = (size_type)in_RDI;
  __l._M_array = __str;
  CLI::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(in_RSI,__l,in_stack_fffffffffffffee8);
  CLI::std::
  allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~allocator(&local_a9);
  pppuVar2 = &local_28;
  do {
    pppuVar2 = pppuVar2 + -4;
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffffec0);
  } while (pppuVar2 != (undefined1 ***)local_a8);
  return;
}

Assistant:

ActionMessage::ActionMessage(std::unique_ptr<Message> message):
    messageAction(CMD_SEND_MESSAGE), messageID(message->messageID), flags(message->flags),
    actionTime(message->time), payload(std::move(message->data)),
    stringData({std::move(message->dest),
                std::move(message->source),
                std::move(message->original_source),
                std::move(message->original_dest)})
{
}